

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void lj_record_ins(jit_State *J)

{
  IROp1 *pIVar1;
  SnapEntry *pSVar2;
  byte bVar3;
  ushort uVar4;
  IROp IVar5;
  IROp *pc;
  GCproto *pt;
  GCproto *pGVar6;
  GCobj *o;
  BCIns *pc_00;
  SnapShot *pSVar7;
  TValue TVar8;
  TRef TVar9;
  IRRef1 IVar10;
  BCLine BVar11;
  uint uVar12;
  int iVar13;
  TRef lnk;
  LoopEvent LVar14;
  TRef TVar15;
  IROp IVar16;
  MMS MVar17;
  TRef *pTVar18;
  ulong uVar19;
  IROp IVar20;
  ushort uVar21;
  ulong uVar22;
  uint uVar23;
  ushort uVar24;
  ulong uVar25;
  uint uVar26;
  TValue *pTVar27;
  ulong uVar28;
  TValue local_78;
  TValue local_70;
  TValue local_68 [4];
  uint local_48;
  uint local_44;
  uint local_40;
  undefined4 local_34;
  
  if (J->postproc != LJ_POST_NONE) {
    switch(J->postproc) {
    case LJ_POST_FIXCOMP:
      uVar28._0_2_ = J[-1].penalty[0x33].val;
      uVar28._2_2_ = J[-1].penalty[0x33].reason;
      uVar28._4_4_ = *(undefined4 *)&J[-1].penalty[0x33].field_0xc;
      pc_00 = (BCIns *)J[-1].penalty[0x33].pc.ptr64;
      rec_comp_fixup(J,pc_00,*pc_00 & 1 ^ (uint)(0xfffeffffffffffff < uVar28));
    case LJ_POST_FIXGUARD:
    case LJ_POST_FIXGUARDSNAP:
      if ((*(short *)&J[-1].penalty[0x33].field_0xe == -1) &&
         (pIVar1 = &(J->fold).ins.field_1.o, *pIVar1 = *pIVar1 ^ 1,
         J->postproc == LJ_POST_FIXGUARDSNAP)) {
        uVar28 = (ulong)(J->cur).nsnap;
        pSVar7 = (J->cur).snap;
        pSVar2 = (J->cur).snapmap +
                 (((uint)pSVar7[uVar28 - 1].nent + pSVar7[uVar28 - 1].mapofs) - 1);
        *pSVar2 = *pSVar2 - 1;
      }
      lj_opt_fold(J);
    case LJ_POST_FIXBOOL:
      if ((*(short *)&J[-1].penalty[0x33].field_0xe == -1) && ((ulong)J->maxslot != 0)) {
        uVar28 = 0;
        do {
          if ((J->base[uVar28] == 0x2007ffd) &&
             ((J->L->base[uVar28].u64 & 0xffff800000000000) == 0xffff000000000000)) {
            J->base[uVar28] = 0x1007ffe;
            break;
          }
          uVar28 = uVar28 + 1;
        } while (J->maxslot != uVar28);
      }
      break;
    case LJ_POST_FIXCONST:
      uVar23 = J->maxslot;
      if (uVar23 != 0) {
        pTVar27 = J->L->base;
        pTVar18 = J->base;
        uVar28 = 0;
        do {
          if ((pTVar18[uVar28] == 0x7fff) && (pTVar27->u64 != 0xffffffffffffffff)) {
            TVar15 = lj_record_constify(J,pTVar27);
            pTVar18 = J->base;
            pTVar18[uVar28] = TVar15;
            uVar23 = J->maxslot;
          }
          uVar28 = uVar28 + 1;
          pTVar27 = pTVar27 + 1;
        } while (uVar28 < uVar23);
      }
      break;
    case LJ_POST_FFRETRY:
      if (0x60 < (byte)*J->pc) {
        return;
      }
    }
    J->postproc = LJ_POST_NONE;
  }
  if (J->needsnap != '\0') {
    J->needsnap = '\0';
    if (J->pt != (GCproto *)0x0) {
      lj_snap_purge(J);
    }
    lj_snap_add(J);
    J->mergesnap = '\x01';
  }
  if (J->bcskip != '\0') {
    J->bcskip = J->bcskip + 0xff;
    return;
  }
  pc = J->pc;
  if ((J->framedepth == 0) && (J->bc_extent <= (uint)((int)pc - *(int *)&J->bc_min))) {
    lj_trace_err(J,LJ_TRERR_LLEAVE);
  }
  if ((J->prof_mode != 0) && (pt = J->pt, pt != (GCproto *)0x0)) {
    pGVar6 = J->prev_pt;
    J->prev_pt = pt;
    if (pGVar6 == (GCproto *)0x0 || pGVar6 == pt) {
      if (J->prof_mode == 0x6c) {
        BVar11 = lj_debug_line(pt,(BCPos)((ulong)((long)pc + (-0x68 - (long)pt)) >> 2));
        iVar13 = J->prev_line;
        J->prev_line = BVar11;
        if (iVar13 != BVar11) goto LAB_0012f97c;
      }
    }
    else {
      J->prev_line = -1;
LAB_0012f97c:
      (J->fold).ins.field_0.ot = 0x1580;
      (J->fold).ins.field_1.op12 = 0;
      lj_opt_fold(J);
      lj_snap_add(J);
    }
  }
  pTVar27 = J->L->base;
  IVar5 = *pc;
  IVar16 = IVar5 & 0xff;
  uVar23 = IVar5 >> 8 & 0xff;
  uVar19 = (ulong)uVar23;
  local_40 = 0;
  uVar4 = lj_bc_mode[IVar16];
  uVar28 = uVar19;
  if ((uVar4 & 7) == 3) {
    local_68[0] = pTVar27[uVar19];
    uVar12 = J->base[uVar19];
    if (J->base[uVar19] == 0) {
      uVar12 = sload(J,uVar23);
    }
    local_40 = uVar12;
    uVar28 = (ulong)local_40;
  }
  uVar25 = (ulong)(IVar5 >> 0x18);
  uVar22 = (ulong)(IVar5 >> 0x10 & 0xff);
  if ((uVar4 >> 3 & 0xf) == 3) {
    local_78 = pTVar27[uVar25];
    local_48 = J->base[uVar25];
    if (local_48 == 0) {
      local_48 = sload(J,IVar5 >> 0x18);
    }
    uVar25 = (ulong)local_48;
  }
  else if ((uVar4 >> 3 & 0xf) == 0) {
    uVar25 = 0;
    uVar22 = (ulong)(IVar5 >> 0x10);
  }
  uVar23 = (uint)uVar22;
  switch(uVar4 >> 7 & 0xf) {
  case 3:
    local_70 = (TValue)*(TValue *)&pTVar27[uVar22].field_4;
    local_44 = J->base[uVar22];
    if (local_44 == 0) {
      local_44 = sload(J,uVar23);
    }
    break;
  default:
    goto switchD_0012fac9_caseD_4;
  case 8:
    local_70.u64 = ~(uVar22 << 0x2f);
    local_44 = uVar23 * 0xffffff + 0x7fff;
    break;
  case 9:
    local_70 = (TValue)*(TValue *)&((TValue *)((J->pt->k).ptr64 + uVar22 * 8))->field_4;
    local_44 = lj_ir_knumint(J,local_70.n);
    break;
  case 10:
    o = *(GCobj **)((J->pt->k).ptr64 + (long)(int)~uVar23 * 8);
    local_70.u64 = (ulong)o | 0xfffd800000000000;
    local_44 = lj_ir_kgc(J,o,IRT_STR);
  }
  uVar22 = (ulong)local_44;
switchD_0012fac9_caseD_4:
  TVar8 = local_78;
  lnk = (TRef)uVar22;
  uVar21 = (ushort)uVar22;
  TVar15 = (TRef)uVar25;
  uVar23 = (uint)(uVar22 >> 0x18);
  uVar24 = (ushort)uVar28;
  uVar12 = (uint)uVar28;
  TVar9 = lnk;
  switch(IVar5 & 0xff) {
  case IR_LT:
  case IR_GE:
  case IR_LE:
  case IR_GT:
    if (((uVar12 & 0x1f000000) == 0xa000000) || ((lnk & 0x1f000000) == 0xa000000)) {
      MVar17 = MM_le - ((IVar5 & IR_LE) == IR_LT);
LAB_0012fd72:
      rec_mm_comp_cdata(J,(RecordIndex *)&local_78.gcr,IVar16,MVar17);
    }
    else {
      uVar26 = (uint)(uVar28 >> 0x18);
      if ((((short)(uVar21 | uVar24) < 0) ||
          (((uVar12 & 0x1f000000) != 0x4000000 && (5 < (uVar26 & 0x1e) - 0xe)))) ||
         (((lnk & 0x1f000000) != 0x4000000 && (5 < (uVar23 & 0x1e) - 0xe)))) {
        uVar26 = uVar26 & 0x1f;
        uVar12 = uVar26;
        if (uVar26 - 0xf < 5) {
          uVar12 = 0x13;
        }
        uVar23 = uVar23 & 0x1f;
        if (uVar23 - 0xf < 5) {
          uVar23 = 0x13;
        }
        if (uVar12 == uVar23) {
LAB_00130661:
          rec_comp_prep(J);
          if (uVar12 == 4) {
            iVar13 = lj_ir_strcmp((GCstr *)(local_68[0].u64 & 0x7fffffffffff),
                                  (GCstr *)(local_70.u64 & 0x7fffffffffff),IVar16);
            TVar15 = lj_ir_call(J,IRCALL_lj_str_cmp,uVar28,uVar22);
            uVar28 = (ulong)TVar15;
            lnk = lj_ir_kint(J,0);
          }
          else {
            if (uVar12 != 0x13) {
              if (uVar12 != 0xe) {
                rec_mm_comp(J,(RecordIndex *)&local_78.gcr,IVar16);
                break;
              }
              goto LAB_00130822;
            }
            iVar13 = lj_ir_numcmp(local_68[0].n,local_70.n,IVar16);
          }
          IVar20 = iVar13 == 0 ^ IVar16;
          uVar21 = 0x93;
        }
        else {
          if ((uVar12 == 0x13) && (uVar23 == 0xe)) {
            (J->fold).ins.field_0.op1 = uVar24;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
            TVar15 = lj_opt_fold(J);
            uVar28 = (ulong)TVar15;
          }
          else {
            if ((uVar12 != 0xe) || (uVar23 != 0x13)) {
              if ((1 < uVar12 - 1) || (uVar12 = uVar26, 1 < uVar23 - 1)) break;
              goto LAB_00130661;
            }
            (J->fold).ins.field_0.op1 = uVar21;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
            lnk = lj_opt_fold(J);
          }
          rec_comp_prep(J);
LAB_00130822:
          IVar16 = IVar5 * 4 & IR_ULT ^ IVar16;
          iVar13 = lj_ir_numcmp(local_68[0].n,local_70.n,IVar16);
          IVar20 = IVar16 ^ IR_UGE;
          if (iVar13 != 0) {
            IVar20 = IVar16;
          }
          uVar21 = 0x8e;
        }
        (J->fold).ins.field_0.ot = (ushort)(IVar20 << 8) | uVar21;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar28;
        (J->fold).ins.field_0.op2 = (IRRef1)lnk;
        lj_opt_fold(J);
        rec_comp_fixup(J,J->pc,(IVar5 ^ IVar20) & IR_GE);
      }
    }
    break;
  case IR_ULT:
  case IR_UGE:
  case IR_ULE:
  case IR_UGT:
  case IR_EQ:
  case IR_NE:
  case IR_ABC:
  case IR_RETF:
    uVar23 = uVar12 & 0x1f000000;
    if ((uVar23 == 0xa000000) || ((lnk & 0x1f000000) == 0xa000000)) {
      MVar17 = MM_eq;
      goto LAB_0012fd72;
    }
    if ((((short)(uVar21 | uVar24) < 0) || (uVar23 == 0xc000000)) || (uVar23 == 0xb000000)) {
      rec_comp_prep(J);
      iVar13 = lj_record_objcmp(J,uVar12,lnk,local_68,&local_70);
      if ((iVar13 == 2) || ((uVar23 != 0xb000000 && (uVar23 != 0xc000000)))) {
        rec_comp_fixup(J,J->pc,(byte)(iVar13 != 0 ^ (byte)IVar5) & 1);
      }
      else if (iVar13 == 1) {
        rec_mm_equal(J,(RecordIndex *)&local_78.gcr,IVar16);
      }
    }
    break;
  case IR_NOP:
  case IR_BASE:
    TVar9 = 0;
    if ((((uVar22 & 0x1e000000) == 0 ^ (byte)IVar5) & 1) == 0) {
      TVar9 = lnk;
    }
  case IR_PVAL:
  case IR_GCSTEP:
    lnk = TVar9;
    uVar23 = (uint)*(byte *)((long)pc + 5);
    if ((uint)*(byte *)((long)pc + 5) < J->maxslot) {
LAB_001304cb:
      J->maxslot = uVar23;
    }
    break;
  case IR_HIOP:
  case IR_LOOP:
    if (lnk == 5) {
      uVar23 = lj_ir_tostr(J,uVar12);
LAB_00130755:
      uVar28 = (ulong)uVar23;
    }
    else if (lnk == 0xf) {
      uVar23 = lj_ir_tonum(J,uVar12);
      goto LAB_00130755;
    }
    J->base[uVar19] = (TRef)uVar28;
    break;
  case IR_USE:
    uVar23 = J->maxslot;
    if (uVar23 < uVar12) {
      memset(J->base + uVar23,0,(ulong)(uVar12 - uVar23) << 2);
    }
    break;
  case IR_PHI:
    lnk = 0x1007ffe;
    if ((uVar22 & 0x1e000000) == 0) {
      lnk = 0x2007ffd;
    }
    goto switchD_0012fb93_caseD_27;
  case IR_RENAME:
    if ((lnk & 0x1f000000) == 0x4000000 || (uVar23 & 0x1e) - 0xe < 6) {
      lnk = lj_opt_narrow_unm(J,lnk,&local_70);
      goto switchD_0012fb93_caseD_27;
    }
    local_78.u64 = local_70.u64;
    MVar17 = MM_unm;
    local_48 = lnk;
    goto LAB_0012fe78;
  case IR_PROF:
    if ((lnk & 0x1f000000) == 0xb000000) {
      (J->fold).ins.field_0.op1 = uVar21;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x49137fff;
      goto LAB_001307c9;
    }
    if ((lnk & 0x1f000000) != 0x4000000) {
      rec_mm_len(J,lnk,&local_70);
      goto LAB_001306fc;
    }
    (J->fold).ins.field_0.op1 = uVar21;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130000;
    lnk = lj_opt_fold(J);
    break;
  case IR_KPRI:
  case IR_KINT:
  case IR_KGC:
  case IR_KPTR:
  case IR_BSWAP:
  case IR_BAND:
  case IR_BOR:
  case IR_BXOR:
    uVar19 = uVar22;
    uVar22 = uVar25;
    goto LAB_0012fc7a;
  case IR_KKPTR:
  case IR_BSHL:
    uVar22 = uVar25;
    TVar15 = lnk;
LAB_0012fdff:
    if (((((uint)uVar22 & 0x1f000000) != 0x4000000) && (5 < ((uint)(uVar22 >> 0x18) & 0x1e) - 0xe))
       || ((TVar15 & 0x1f000000) != 0x4000000 && 5 < (TVar15 >> 0x18 & 0x1e) - 0xe)) {
      MVar17 = MM_mod;
      goto LAB_0012fe78;
    }
    lnk = lj_opt_narrow_mod(J,(uint)uVar22,TVar15,&local_78,&local_70);
    break;
  case IR_KNULL:
  case IR_KNUM:
  case IR_KINT64:
  case IR_KSLOT:
  case IR_BNOT:
    local_68[0] = local_78;
    local_78.u64 = local_70.u64;
    local_70 = TVar8;
    uVar19 = uVar25;
    local_48 = lnk;
    local_44 = TVar15;
    if (IVar16 == IR_BNOT) goto LAB_0012fdff;
LAB_0012fc7a:
    if (((((uint)uVar22 & 0x1f000000) != 0x4000000) && (5 < ((uint)(uVar22 >> 0x18) & 0x1e) - 0xe))
       || (((TRef)uVar19 & 0x1f000000) != 0x4000000 && 5 < ((uint)(uVar19 >> 0x18) & 0x1e) - 0xe)) {
      MVar17 = (MMS)(uVar4 >> 0xb);
LAB_0012fe78:
      rec_mm_arith(J,(RecordIndex *)&local_78.gcr,MVar17);
      goto LAB_001306fc;
    }
    lnk = lj_opt_narrow_arith(J,(uint)uVar22,(TRef)uVar19,&local_78,&local_70,
                              (uVar4 >> 0xb) + IR_BNOT);
    break;
  case IR_BSHR:
    if (((TVar15 & 0x1f000000) != 0x4000000 && 5 < ((uint)(uVar25 >> 0x18) & 0x1e) - 0xe) ||
       ((lnk & 0x1f000000) != 0x4000000 && 5 < (uVar23 & 0x1e) - 0xe)) {
      MVar17 = MM_pow;
      goto LAB_0012fe78;
    }
    lnk = lj_opt_narrow_pow(J,TVar15,lnk,&local_78,&local_70);
    goto switchD_0012fb93_caseD_27;
  case IR_BSAR:
    lnk = rec_cat(J,TVar15,lnk);
  case IR_BROL:
  case IR_SUB:
  case IR_MUL:
  case IR_STRTO:
    goto switchD_0012fb93_caseD_27;
  case IR_BROR:
    lnk = lj_ir_kgc(J,*(GCobj **)((J->pt->k).ptr64 + ~uVar22 * 8),IRT_CDATA);
    goto switchD_0012fb93_caseD_27;
  case IR_ADD:
    lnk = lj_ir_kint(J,(int)(short)uVar21);
    goto switchD_0012fb93_caseD_27;
  case IR_DIV:
    if (J->maxslot < uVar12) {
      J->base[uVar12 - 1] = 0;
    }
    if (uVar12 <= lnk) {
      pTVar18 = J->base;
      uVar19 = uVar28;
      do {
        uVar23 = (int)uVar19 + 1;
        uVar28 = (ulong)uVar23;
        pTVar18[uVar19] = 0x7fff;
        uVar19 = uVar28;
      } while (uVar23 <= lnk);
    }
    if (lnk < J->maxslot) break;
    uVar23 = lnk + 1;
    goto LAB_001304cb;
  case IR_MOD:
    lnk = rec_upvalue(J,lnk,0);
    goto switchD_0012fb93_caseD_27;
  case IR_POW:
  case IR_NEG:
  case IR_ABS:
  case IR_LDEXP:
    rec_upvalue(J,uVar12,lnk);
    break;
  case IR_MIN:
  case IR_MAX:
switchD_0012fb93_caseD_32:
    (J->errinfo).n = (double)IVar16;
    lj_trace_err_info(J,LJ_TRERR_NYIBC);
  case IR_FPMATH:
    IVar10 = 0x801;
    if ((lnk & 0x7ff) != 0x7ff) {
      IVar10 = (IRRef1)(lnk & 0x7ff);
    }
    (J->fold).ins.field_0.ot = 0x518b;
    (J->fold).ins.field_0.op1 = IVar10;
    (J->fold).ins.field_0.op2 = (IRRef1)(lnk >> 0xb);
    goto LAB_001307c9;
  case IR_ADDOV:
    TVar15 = lj_ir_kgc(J,*(GCobj **)((J->pt->k).ptr64 + ~uVar22 * 8),IRT_TAB);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x528b0000;
LAB_001307c9:
    lnk = lj_opt_fold(J);
    goto switchD_0012fb93_caseD_27;
  case IR_SUBOV:
  case IR_MULOV:
    local_78.u64 = (J->fn->c).env.gcptr64 | 0xfffa000000000000;
    TVar15 = getcurrf(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x450b0001;
    local_48 = lj_opt_fold(J);
    local_34 = 100;
    goto LAB_0012fdec;
  case IR_AREF:
  case IR_HREFK:
  case IR_UREFO:
  case IR_UREFC:
    goto switchD_0012fb93_caseD_38;
  case IR_HREF:
  case IR_FREF:
    local_70.n = (lua_Number)(int)lnk;
    local_44 = lj_ir_kint(J,lnk);
    goto switchD_0012fb93_caseD_38;
  case IR_NEWREF:
  case IR_STRREF:
    local_34 = 0;
LAB_0012fdec:
    lnk = lj_record_idx(J,(RecordIndex *)&local_78.gcr);
    goto switchD_0012fb93_caseD_27;
  case IR_TMPREF:
    rec_tsetm(J,uVar12,(BCReg)((ulong)((long)J->L->top - (long)J->L->base) >> 3),local_70._0_4_);
    break;
  case IR_LREF:
    uVar22 = (ulong)(~uVar12 + (int)((ulong)((long)J->L->top - (long)J->L->base) >> 3));
    goto LAB_00130568;
  case IR_ALOAD:
    goto LAB_00130568;
  case IR_HLOAD:
    uVar22 = (ulong)(~uVar12 + (int)((ulong)((long)J->L->top - (long)J->L->base) >> 3));
    goto LAB_0013054d;
  case IR_ULOAD:
LAB_0013054d:
    lnk = (TRef)uVar22;
    lj_record_tailcall(J,uVar12,uVar22 - 1);
    break;
  case IR_FLOAD:
    pTVar18 = J->base;
    TVar15 = pTVar18[uVar12 - 3];
    if (TVar15 == 0) {
      TVar15 = sload(J,uVar12 - 3);
      pTVar18 = J->base;
    }
    pTVar18[uVar28] = TVar15;
    TVar15 = pTVar18[uVar12 - 2];
    if (TVar15 == 0) {
      TVar15 = sload(J,uVar12 - 2);
      pTVar18 = J->base;
    }
    pTVar18[uVar12 + 2] = TVar15;
    TVar15 = pTVar18[uVar12 - 1];
    if (TVar15 == 0) {
      TVar15 = sload(J,uVar12 - 1);
      pTVar18 = J->base;
    }
    pTVar18[uVar12 + 3] = TVar15;
    pTVar27 = J->L->base;
    pTVar27[uVar28] = pTVar27[uVar28 - 3];
    TVar8 = (pTVar27 + (uVar28 - 2))[1];
    pTVar27[uVar28 + 2] = pTVar27[uVar28 - 2];
    (pTVar27 + uVar28 + 2)[1] = TVar8;
LAB_00130568:
    lnk = (TRef)uVar22;
    lj_record_call(J,uVar12,uVar22 - 1);
    break;
  case IR_XLOAD:
    LVar14 = rec_itern(J,uVar12,TVar15);
    rec_loop_interp(J,pc,LVar14);
    break;
  case IR_SLOAD:
    rec_varg(J,uVar12,uVar25 - 1);
    break;
  case IR_VLOAD:
    rec_isnext(J,uVar12);
    break;
  case IR_ALEN:
    uVar22 = (ulong)(((int)((ulong)((long)J->L->top - (long)J->L->base) >> 3) - uVar12) + 1);
    goto LAB_00130129;
  case IR_ASTORE:
  case IR_HSTORE:
  case IR_USTORE:
LAB_00130129:
    lnk = (TRef)uVar22;
    if (J->prof_mode == 0x66) {
      (J->fold).ins.field_0.ot = 0x1580;
      (J->fold).ins.field_1.op12 = 0;
      lj_opt_fold(J);
      J->prev_pt = (GCproto *)0x0;
      lj_snap_add(J);
    }
    lj_record_ret(J,uVar12,uVar22 - 1);
    break;
  case IR_FSTORE:
    LVar14 = rec_for(J,pc,0);
    if (LVar14 != LOOPEV_LEAVE) {
      J->loopref = (J->cur).nins;
    }
    break;
  case IR_XSTORE:
    LVar14 = rec_for(J,pc,0);
    if (LVar14 != LOOPEV_LEAVE) {
      lj_record_stop(J,LJ_TRLINK_ROOT,(uint)*(ushort *)((long)pc + uVar22 * 4 + -0x1fffe));
      goto switchD_0012fb93_caseD_27;
    }
    break;
  case IR_SNEW:
    LVar14 = rec_for(J,pc + (uVar22 - 0x8000),1);
    goto LAB_001303f9;
  case IR_XSNEW:
  case IR_CNEW:
  case IR_BUFPUT:
  case IR_XBAR:
  case IR_TOSTR:
    lj_trace_err(J,LJ_TRERR_BLACKL);
  case IR_TNEW:
    LVar14 = rec_for(J,pc + ((ulong)*(ushort *)(J->trace[uVar22].gcptr64 + 0x52) - 0x8000),1);
    goto LAB_001302e7;
  case IR_TDUP:
    LVar14 = rec_iterl(J,*pc);
LAB_001303f9:
    rec_loop_interp(J,pc,LVar14);
    goto switchD_0012fb93_caseD_27;
  case IR_CNEWI:
    LVar14 = rec_iterl(J,*(BCIns *)(J->trace[uVar22].gcptr64 + 0x50));
LAB_001302e7:
    rec_loop_jit(J,lnk,LVar14);
    goto switchD_0012fb93_caseD_27;
  case IR_BUFHDR:
    if (uVar12 < J->maxslot) {
      J->maxslot = uVar12;
    }
    J->pc = J->pc + 1;
    rec_loop_interp(J,pc,LOOPEV_ENTER);
    break;
  case IR_BUFSTR:
    bVar3 = *(byte *)(J->trace[uVar22].gcptr64 + 0x50);
    if (uVar12 < J->maxslot) {
      J->maxslot = uVar12;
    }
    J->pc = J->pc + (bVar3 - 0x4d < 0xfffffffc);
    rec_loop_jit(J,lnk,LOOPEV_ENTER);
    break;
  case IR_TBAR:
    if (uVar12 < J->maxslot) {
      J->maxslot = uVar12;
    }
    break;
  case IR_OBAR:
    goto LAB_00130049;
  case IR_CONV:
    rec_func_jit(J,lnk);
    goto switchD_0012fb93_caseD_27;
  case IR_TOBIT:
    rec_func_vararg(J);
LAB_00130049:
    rec_func_setup(J);
    check_call_unroll(J,0);
    goto switchD_0012fb93_caseD_27;
  case IR_CALLN:
  case IR_CALLA:
    goto switchD_0012fb93_caseD_5f;
  default:
    if (IVar16 < IR_CALLL) goto switchD_0012fb93_caseD_32;
    goto switchD_0012fb93_caseD_5f;
  }
LAB_001306c3:
  if (((uVar4 & 7) == 1) && (lnk != 0)) {
    pTVar18 = J->base;
    uVar23 = (uint)uVar28;
    pTVar18[uVar28] = lnk;
    if (J->maxslot <= uVar23) {
      if (J->maxslot < uVar23) {
        pTVar18[uVar23 - 1] = 0;
      }
      J->maxslot = uVar23 + 1;
    }
  }
LAB_001306fc:
  if (((J->cur).nins <= J->param[1] + 0x8001U) && (0x8000U - J->param[2] <= (J->cur).nk)) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_TRACEOV);
switchD_0012fb93_caseD_5f:
  lj_ffrecord_func(J);
switchD_0012fb93_caseD_27:
  goto LAB_001306c3;
switchD_0012fb93_caseD_38:
  local_34 = 100;
  goto LAB_0012fdec;
}

Assistant:

void lj_record_ins(jit_State *J)
{
  cTValue *lbase;
  RecordIndex ix;
  const BCIns *pc;
  BCIns ins;
  BCOp op;
  TRef ra, rb, rc;

  /* Perform post-processing action before recording the next instruction. */
  if (LJ_UNLIKELY(J->postproc != LJ_POST_NONE)) {
    switch (J->postproc) {
    case LJ_POST_FIXCOMP:  /* Fixup comparison. */
      pc = (const BCIns *)(uintptr_t)J2G(J)->tmptv.u64;
      rec_comp_fixup(J, pc, (!tvistruecond(&J2G(J)->tmptv2) ^ (bc_op(*pc)&1)));
      /* fallthrough */
    case LJ_POST_FIXGUARD:  /* Fixup and emit pending guard. */
    case LJ_POST_FIXGUARDSNAP:  /* Fixup and emit pending guard and snapshot. */
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	J->fold.ins.o ^= 1;  /* Flip guard to opposite. */
	if (J->postproc == LJ_POST_FIXGUARDSNAP) {
	  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
	  J->cur.snapmap[snap->mapofs+snap->nent-1]--;  /* False -> true. */
	}
      }
      lj_opt_fold(J);  /* Emit pending guard. */
      /* fallthrough */
    case LJ_POST_FIXBOOL:
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Fixup stack slot (if any). */
	  if (J->base[s] == TREF_TRUE && tvisfalse(&tv[s])) {
	    J->base[s] = TREF_FALSE;
	    break;
	  }
      }
      break;
    case LJ_POST_FIXCONST:
      {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Constify stack slots (if any). */
	  if (J->base[s] == TREF_NIL && !tvisnil(&tv[s]))
	    J->base[s] = lj_record_constify(J, &tv[s]);
      }
      break;
    case LJ_POST_FFRETRY:  /* Suppress recording of retried fast function. */
      if (bc_op(*J->pc) >= BC__MAX)
	return;
      break;
    default: lj_assertJ(0, "bad post-processing mode"); break;
    }
    J->postproc = LJ_POST_NONE;
  }

  /* Need snapshot before recording next bytecode (e.g. after a store). */
  if (J->needsnap) {
    J->needsnap = 0;
    if (J->pt) lj_snap_purge(J);
    lj_snap_add(J);
    J->mergesnap = 1;
  }

  /* Skip some bytecodes. */
  if (LJ_UNLIKELY(J->bcskip > 0)) {
    J->bcskip--;
    return;
  }

  /* Record only closed loops for root traces. */
  pc = J->pc;
  if (J->framedepth == 0 &&
     (MSize)((char *)pc - (char *)J->bc_min) >= J->bc_extent)
    lj_trace_err(J, LJ_TRERR_LLEAVE);

#ifdef LUA_USE_ASSERT
  rec_check_slots(J);
  rec_check_ir(J);
#endif

#if LJ_HASPROFILE
  rec_profile_ins(J, pc);
#endif

  /* Keep a copy of the runtime values of var/num/str operands. */
#define rav	(&ix.valv)
#define rbv	(&ix.tabv)
#define rcv	(&ix.keyv)

  lbase = J->L->base;
  ins = *pc;
  op = bc_op(ins);
  ra = bc_a(ins);
  ix.val = 0;
  switch (bcmode_a(op)) {
  case BCMvar:
    copyTV(J->L, rav, &lbase[ra]); ix.val = ra = getslot(J, ra); break;
  default: break;  /* Handled later. */
  }
  rb = bc_b(ins);
  rc = bc_c(ins);
  switch (bcmode_b(op)) {
  case BCMnone: rb = 0; rc = bc_d(ins); break;  /* Upgrade rc to 'rd'. */
  case BCMvar:
    copyTV(J->L, rbv, &lbase[rb]); ix.tab = rb = getslot(J, rb); break;
  default: break;  /* Handled later. */
  }
  switch (bcmode_c(op)) {
  case BCMvar:
    copyTV(J->L, rcv, &lbase[rc]); ix.key = rc = getslot(J, rc); break;
  case BCMpri: setpriV(rcv, ~rc); ix.key = rc = TREF_PRI(IRT_NIL+rc); break;
  case BCMnum: { cTValue *tv = proto_knumtv(J->pt, rc);
    copyTV(J->L, rcv, tv); ix.key = rc = tvisint(tv) ? lj_ir_kint(J, intV(tv)) :
    lj_ir_knumint(J, numV(tv)); } break;
  case BCMstr: { GCstr *s = gco2str(proto_kgc(J->pt, ~(ptrdiff_t)rc));
    setstrV(J->L, rcv, s); ix.key = rc = lj_ir_kstr(J, s); } break;
  default: break;  /* Handled later. */
  }

  switch (op) {

  /* -- Comparison ops ---------------------------------------------------- */

  case BC_ISLT: case BC_ISGE: case BC_ISLE: case BC_ISGT:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, ((int)op & 2) ? MM_le : MM_lt);
      break;
    }
#endif
    /* Emit nothing for two numeric or string consts. */
    if (!(tref_isk2(ra,rc) && tref_isnumber_str(ra) && tref_isnumber_str(rc))) {
      IRType ta = tref_isinteger(ra) ? IRT_INT : tref_type(ra);
      IRType tc = tref_isinteger(rc) ? IRT_INT : tref_type(rc);
      int irop;
      if (ta != tc) {
	/* Widen mixed number/int comparisons to number/number comparison. */
	if (ta == IRT_INT && tc == IRT_NUM) {
	  ra = emitir(IRTN(IR_CONV), ra, IRCONV_NUM_INT);
	  ta = IRT_NUM;
	} else if (ta == IRT_NUM && tc == IRT_INT) {
	  rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
	} else if (LJ_52) {
	  ta = IRT_NIL;  /* Force metamethod for different types. */
	} else if (!((ta == IRT_FALSE || ta == IRT_TRUE) &&
		     (tc == IRT_FALSE || tc == IRT_TRUE))) {
	  break;  /* Interpreter will throw for two different types. */
	}
      }
      rec_comp_prep(J);
      irop = (int)op - (int)BC_ISLT + (int)IR_LT;
      if (ta == IRT_NUM) {
	if ((irop & 1)) irop ^= 4;  /* ISGE/ISGT are unordered. */
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 5;
      } else if (ta == IRT_INT) {
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 1;
      } else if (ta == IRT_STR) {
	if (!lj_ir_strcmp(strV(rav), strV(rcv), (IROp)irop)) irop ^= 1;
	ra = lj_ir_call(J, IRCALL_lj_str_cmp, ra, rc);
	rc = lj_ir_kint(J, 0);
	ta = IRT_INT;
      } else {
	rec_mm_comp(J, &ix, (int)op);
	break;
      }
      emitir(IRTG(irop, ta), ra, rc);
      rec_comp_fixup(J, J->pc, ((int)op ^ irop) & 1);
    }
    break;

  case BC_ISEQV: case BC_ISNEV:
  case BC_ISEQS: case BC_ISNES:
  case BC_ISEQN: case BC_ISNEN:
  case BC_ISEQP: case BC_ISNEP:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, MM_eq);
      break;
    }
#endif
    /* Emit nothing for two non-table, non-udata consts. */
    if (!(tref_isk2(ra, rc) && !(tref_istab(ra) || tref_isudata(ra)))) {
      int diff;
      rec_comp_prep(J);
      diff = lj_record_objcmp(J, ra, rc, rav, rcv);
      if (diff == 2 || !(tref_istab(ra) || tref_isudata(ra)))
	rec_comp_fixup(J, J->pc, ((int)op & 1) == !diff);
      else if (diff == 1)  /* Only check __eq if different, but same type. */
	rec_mm_equal(J, &ix, (int)op);
    }
    break;

  /* -- Unary test and copy ops ------------------------------------------- */

  case BC_ISTC: case BC_ISFC:
    if ((op & 1) == tref_istruecond(rc))
      rc = 0;  /* Don't store if condition is not true. */
    /* fallthrough */
  case BC_IST: case BC_ISF:  /* Type specialization suffices. */
    if (bc_a(pc[1]) < J->maxslot)
      J->maxslot = bc_a(pc[1]);  /* Shrink used slots. */
    break;

  case BC_ISTYPE: case BC_ISNUM:
    /* These coercions need to correspond with lj_meta_istype(). */
    if (LJ_DUALNUM && rc == ~LJ_TNUMX+1)
      ra = lj_opt_narrow_toint(J, ra);
    else if (rc == ~LJ_TNUMX+2)
      ra = lj_ir_tonum(J, ra);
    else if (rc == ~LJ_TSTR+1)
      ra = lj_ir_tostr(J, ra);
    /* else: type specialization suffices. */
    J->base[bc_a(ins)] = ra;
    break;

  /* -- Unary ops --------------------------------------------------------- */

  case BC_NOT:
    /* Type specialization already forces const result. */
    rc = tref_istruecond(rc) ? TREF_FALSE : TREF_TRUE;
    break;

  case BC_LEN:
    if (tref_isstr(rc))
      rc = emitir(IRTI(IR_FLOAD), rc, IRFL_STR_LEN);
    else if (!LJ_52 && tref_istab(rc))
      rc = emitir(IRTI(IR_ALEN), rc, TREF_NIL);
    else
      rc = rec_mm_len(J, rc, rcv);
    break;

  /* -- Arithmetic ops ---------------------------------------------------- */

  case BC_UNM:
    if (tref_isnumber_str(rc)) {
      rc = lj_opt_narrow_unm(J, rc, rcv);
    } else {
      ix.tab = rc;
      copyTV(J->L, &ix.tabv, rcv);
      rc = rec_mm_arith(J, &ix, MM_unm);
    }
    break;

  case BC_ADDNV: case BC_SUBNV: case BC_MULNV: case BC_DIVNV: case BC_MODNV:
    /* Swap rb/rc and rbv/rcv. rav is temp. */
    ix.tab = rc; ix.key = rc = rb; rb = ix.tab;
    copyTV(J->L, rav, rbv);
    copyTV(J->L, rbv, rcv);
    copyTV(J->L, rcv, rav);
    if (op == BC_MODNV)
      goto recmod;
    /* fallthrough */
  case BC_ADDVN: case BC_SUBVN: case BC_MULVN: case BC_DIVVN:
  case BC_ADDVV: case BC_SUBVV: case BC_MULVV: case BC_DIVVV: {
    MMS mm = bcmode_mm(op);
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_arith(J, rb, rc, rbv, rcv,
			       (int)mm - (int)MM_add + (int)IR_ADD);
    else
      rc = rec_mm_arith(J, &ix, mm);
    break;
    }

  case BC_MODVN: case BC_MODVV:
  recmod:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_mod(J, rb, rc, rbv, rcv);
    else
      rc = rec_mm_arith(J, &ix, MM_mod);
    break;

  case BC_POW:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_pow(J, rb, rc, rbv, rcv);
    else
      rc = rec_mm_arith(J, &ix, MM_pow);
    break;

  /* -- Miscellaneous ops ------------------------------------------------- */

  case BC_CAT:
    rc = rec_cat(J, rb, rc);
    break;

  /* -- Constant and move ops --------------------------------------------- */

  case BC_MOV:
    /* Clear gap of method call to avoid resurrecting previous refs. */
    if (ra > J->maxslot) {
#if LJ_FR2
      memset(J->base + J->maxslot, 0, (ra - J->maxslot) * sizeof(TRef));
#else
      J->base[ra-1] = 0;
#endif
    }
    break;
  case BC_KSTR: case BC_KNUM: case BC_KPRI:
    break;
  case BC_KSHORT:
    rc = lj_ir_kint(J, (int32_t)(int16_t)rc);
    break;
  case BC_KNIL:
    if (LJ_FR2 && ra > J->maxslot)
      J->base[ra-1] = 0;
    while (ra <= rc)
      J->base[ra++] = TREF_NIL;
    if (rc >= J->maxslot) J->maxslot = rc+1;
    break;
#if LJ_HASFFI
  case BC_KCDATA:
    rc = lj_ir_kgc(J, proto_kgc(J->pt, ~(ptrdiff_t)rc), IRT_CDATA);
    break;
#endif

  /* -- Upvalue and function ops ------------------------------------------ */

  case BC_UGET:
    rc = rec_upvalue(J, rc, 0);
    break;
  case BC_USETV: case BC_USETS: case BC_USETN: case BC_USETP:
    rec_upvalue(J, ra, rc);
    break;

  /* -- Table ops --------------------------------------------------------- */

  case BC_GGET: case BC_GSET:
    settabV(J->L, &ix.tabv, tabref(J->fn->l.env));
    ix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), getcurrf(J), IRFL_FUNC_ENV);
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TGETB: case BC_TSETB:
    setintV(&ix.keyv, (int32_t)rc);
    ix.key = lj_ir_kint(J, (int32_t)rc);
    /* fallthrough */
  case BC_TGETV: case BC_TGETS: case BC_TSETV: case BC_TSETS:
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;
  case BC_TGETR: case BC_TSETR:
    ix.idxchain = 0;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TSETM:
    rec_tsetm(J, ra, (BCReg)(J->L->top - J->L->base), (int32_t)rcv->u32.lo);
    break;

  case BC_TNEW:
    rc = rec_tnew(J, rc);
    break;
  case BC_TDUP:
    rc = emitir(IRTG(IR_TDUP, IRT_TAB),
		lj_ir_ktab(J, gco2tab(proto_kgc(J->pt, ~(ptrdiff_t)rc))), 0);
#ifdef LUAJIT_ENABLE_TABLE_BUMP
    J->rbchash[(rc & (RBCHASH_SLOTS-1))].ref = tref_ref(rc);
    setmref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pc, pc);
    setgcref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pt, obj2gco(J->pt));
#endif
    break;

  /* -- Calls and vararg handling ----------------------------------------- */

  case BC_ITERC:
    J->base[ra] = getslot(J, ra-3);
    J->base[ra+1+LJ_FR2] = getslot(J, ra-2);
    J->base[ra+2+LJ_FR2] = getslot(J, ra-1);
    { /* Do the actual copy now because lj_record_call needs the values. */
      TValue *b = &J->L->base[ra];
      copyTV(J->L, b, b-3);
      copyTV(J->L, b+1+LJ_FR2, b-2);
      copyTV(J->L, b+2+LJ_FR2, b-1);
    }
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  /* L->top is set to L->base+ra+rc+NARGS-1+1. See lj_dispatch_ins(). */
  case BC_CALLM:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALL:
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_CALLMT:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALLT:
    lj_record_tailcall(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_VARG:
    rec_varg(J, ra, (ptrdiff_t)rb-1);
    break;

  /* -- Returns ----------------------------------------------------------- */

  case BC_RETM:
    /* L->top is set to L->base+ra+rc+NRESULTS-1, see lj_dispatch_ins(). */
    rc = (BCReg)(J->L->top - J->L->base) - ra + 1;
    /* fallthrough */
  case BC_RET: case BC_RET0: case BC_RET1:
#if LJ_HASPROFILE
    rec_profile_ret(J);
#endif
    lj_record_ret(J, ra, (ptrdiff_t)rc-1);
    break;

  /* -- Loops and branches ------------------------------------------------ */

  case BC_FORI:
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)
      J->loopref = J->cur.nins;
    break;
  case BC_JFORI:
    lj_assertJ(bc_op(pc[(ptrdiff_t)rc-BCBIAS_J]) == BC_JFORL,
	       "JFORI does not point to JFORL");
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)  /* Link to existing loop. */
      lj_record_stop(J, LJ_TRLINK_ROOT, bc_d(pc[(ptrdiff_t)rc-BCBIAS_J]));
    /* Continue tracing if the loop is not entered. */
    break;

  case BC_FORL:
    rec_loop_interp(J, pc, rec_for(J, pc+((ptrdiff_t)rc-BCBIAS_J), 1));
    break;
  case BC_ITERL:
    rec_loop_interp(J, pc, rec_iterl(J, *pc));
    break;
  case BC_ITERN:
    rec_loop_interp(J, pc, rec_itern(J, ra, rb));
    break;
  case BC_LOOP:
    rec_loop_interp(J, pc, rec_loop(J, ra, 1));
    break;

  case BC_JFORL:
    rec_loop_jit(J, rc, rec_for(J, pc+bc_j(traceref(J, rc)->startins), 1));
    break;
  case BC_JITERL:
    rec_loop_jit(J, rc, rec_iterl(J, traceref(J, rc)->startins));
    break;
  case BC_JLOOP:
    rec_loop_jit(J, rc, rec_loop(J, ra,
				 !bc_isret(bc_op(traceref(J, rc)->startins))));
    break;

  case BC_IFORL:
  case BC_IITERL:
  case BC_ILOOP:
  case BC_IFUNCF:
  case BC_IFUNCV:
    lj_trace_err(J, LJ_TRERR_BLACKL);
    break;

  case BC_JMP:
    if (ra < J->maxslot)
      J->maxslot = ra;  /* Shrink used slots. */
    break;

  case BC_ISNEXT:
    rec_isnext(J, ra);
    break;

  /* -- Function headers -------------------------------------------------- */

  case BC_FUNCF:
    rec_func_lua(J);
    break;
  case BC_JFUNCF:
    rec_func_jit(J, rc);
    break;

  case BC_FUNCV:
    rec_func_vararg(J);
    rec_func_lua(J);
    break;
  case BC_JFUNCV:
    /* Cannot happen. No hotcall counting for varag funcs. */
    lj_assertJ(0, "unsupported vararg hotcall");
    break;

  case BC_FUNCC:
  case BC_FUNCCW:
    lj_ffrecord_func(J);
    break;

  default:
    if (op >= BC__MAX) {
      lj_ffrecord_func(J);
      break;
    }
    /* fallthrough */
  case BC_UCLO:
  case BC_FNEW:
    setintV(&J->errinfo, (int32_t)op);
    lj_trace_err_info(J, LJ_TRERR_NYIBC);
    break;
  }

  /* rc == 0 if we have no result yet, e.g. pending __index metamethod call. */
  if (bcmode_a(op) == BCMdst && rc) {
    J->base[ra] = rc;
    if (ra >= J->maxslot) {
#if LJ_FR2
      if (ra > J->maxslot) J->base[ra-1] = 0;
#endif
      J->maxslot = ra+1;
    }
  }

#undef rav
#undef rbv
#undef rcv

  /* Limit the number of recorded IR instructions and constants. */
  if (J->cur.nins > REF_FIRST+(IRRef)J->param[JIT_P_maxrecord] ||
      J->cur.nk < REF_BIAS-(IRRef)J->param[JIT_P_maxirconst])
    lj_trace_err(J, LJ_TRERR_TRACEOV);
}